

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_connection_base::add_headers
          (web_connection_base *this,string *request,session_settings *sett,bool using_proxy)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string *psVar4;
  reference ppVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  const_iterator __end2;
  const_iterator __begin2;
  headers_t *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  byte local_21;
  session_settings *psStack_20;
  bool using_proxy_local;
  session_settings *sett_local;
  string *request_local;
  web_connection_base *this_local;
  
  local_21 = using_proxy;
  psStack_20 = sett;
  sett_local = (session_settings *)request;
  request_local = (string *)this;
  ::std::__cxx11::string::operator+=((string *)request,"Host: ");
  ::std::__cxx11::string::operator+=((string *)sett_local,(string *)&this->m_host);
  if (((((this->super_peer_connection).field_0x888 & 1) != 0) ||
      (bVar1 = session_settings::get_bool
                         ((this->super_peer_connection).super_peer_connection_hot_members.m_settings
                          ,0x802d), bVar1)) &&
     (bVar1 = session_settings::get_bool
                        ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                         0x8026), !bVar1)) {
    ::std::__cxx11::string::operator+=((string *)sett_local,"\r\nUser-Agent: ");
    psVar4 = session_settings::get_str_abi_cxx11_
                       ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,0
                       );
    ::std::__cxx11::string::operator+=((string *)sett_local,(string *)psVar4);
  }
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ::std::__cxx11::string::operator+=((string *)sett_local,"\r\nAuthorization: ");
    ::std::__cxx11::string::operator+=((string *)sett_local,(string *)&this->m_external_auth);
  }
  else {
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)sett_local,"\r\nAuthorization: Basic ");
      ::std::__cxx11::string::operator+=((string *)sett_local,(string *)&this->m_basic_auth);
    }
  }
  iVar2 = session_settings::get_int(psStack_20,0x407b);
  if (iVar2 == 5) {
    ::std::__cxx11::string::operator+=((string *)sett_local,"\r\nProxy-Authorization: Basic ");
    psVar4 = session_settings::get_str_abi_cxx11_(psStack_20,7);
    ::std::operator+(&local_88,psVar4,":");
    psVar4 = session_settings::get_str_abi_cxx11_(psStack_20,8);
    ::std::operator+(&local_68,&local_88,psVar4);
    base64encode(&local_48,&local_68);
    ::std::__cxx11::string::operator+=((string *)sett_local,(string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  __end2 = ::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->m_extra_headers);
  h = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)::std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->m_extra_headers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&h), bVar1) {
    ppVar5 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end2);
    ::std::__cxx11::string::operator+=((string *)sett_local,"\r\n");
    ::std::__cxx11::string::operator+=((string *)sett_local,(string *)ppVar5);
    ::std::__cxx11::string::operator+=((string *)sett_local,": ");
    ::std::__cxx11::string::operator+=((string *)sett_local,(string *)&ppVar5->second);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end2);
  }
  if ((local_21 & 1) != 0) {
    ::std::__cxx11::string::operator+=((string *)sett_local,"\r\nProxy-Connection: keep-alive");
  }
  if ((((this->super_peer_connection).field_0x888 & 1) != 0) || ((local_21 & 1) != 0)) {
    ::std::__cxx11::string::operator+=((string *)sett_local,"\r\nConnection: keep-alive");
  }
  return;
}

Assistant:

void web_connection_base::add_headers(std::string& request
		, aux::session_settings const& sett, bool const using_proxy) const
	{
		request += "Host: ";
		request += m_host;
		if ((m_first_request || m_settings.get_bool(settings_pack::always_send_user_agent))
			&& !m_settings.get_bool(settings_pack::anonymous_mode))
		{
			request += "\r\nUser-Agent: ";
			request += m_settings.get_str(settings_pack::user_agent);
		}
		if (!m_external_auth.empty())
		{
			request += "\r\nAuthorization: ";
			request += m_external_auth;
		}
		else if (!m_basic_auth.empty())
		{
			request += "\r\nAuthorization: Basic ";
			request += m_basic_auth;
		}
		if (sett.get_int(settings_pack::proxy_type) == settings_pack::http_pw)
		{
			request += "\r\nProxy-Authorization: Basic ";
			request += base64encode(sett.get_str(settings_pack::proxy_username)
				+ ":" + sett.get_str(settings_pack::proxy_password));
		}
		for (auto const& h : m_extra_headers)
		{
			request += "\r\n";
			request += h.first;
			request += ": ";
			request += h.second;
		}
		if (using_proxy) {
			request += "\r\nProxy-Connection: keep-alive";
		}
		if (m_first_request || using_proxy) {
			request += "\r\nConnection: keep-alive";
		}
	}